

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

uint32_t xray_re::xr_file_system::file_age(char *path)

{
  int iVar1;
  uint32_t uVar2;
  path *ppVar3;
  stat st;
  path pStack_c8;
  stat local_a0;
  
  CPath::CPath((CPath *)&pStack_c8,path);
  ppVar3 = CPath::make_preferred_abi_cxx11_((CPath *)&pStack_c8);
  iVar1 = stat((ppVar3->_M_pathname)._M_dataplus._M_p,&local_a0);
  std::filesystem::__cxx11::path::~path(&pStack_c8);
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = (uint32_t)local_a0.st_mtim.tv_sec;
  }
  return uVar2;
}

Assistant:

uint32_t xr_file_system::file_age(const char* path)
{
struct stat st;

	if(stat(CPath(path).make_preferred().c_str(), &st) == 0)
		return uint32_t(st.st_mtime);

	return 0;
}